

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

void __thiscall
Parse::SMTLIB2::readDefineFun
          (SMTLIB2 *this,string *name,LExprList *iArgs,LExpr *oSort,LExpr *body,TermStack *typeArgs,
          bool recursive)

{
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ***pppDVar1;
  TermList *pTVar2;
  uint64_t uVar3;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  **ppDVar4;
  List<Kernel::Unit_*> *pLVar5;
  string *name_00;
  bool bVar6;
  uint uVar7;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar8;
  LExpr *sExpr;
  TermList TVar9;
  DeclaredSymbol DVar10;
  anon_union_8_2_43a9448f_for_ParseResult_3 arg2;
  Formula *formula;
  Literal *pLVar11;
  undefined4 *puVar12;
  Unit *this_00;
  List<Kernel::Unit_*> *pLVar13;
  Term *pTVar14;
  ulong uVar15;
  undefined8 *puVar16;
  long *plVar17;
  size_type *psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_8_2_43a9448f_for_ParseResult_3 **ppaVar20;
  long *plVar21;
  TermList *ta;
  TermList *pTVar22;
  SMTLIB2 *pSVar23;
  FIFO *pFVar24;
  TermList TVar25;
  SymbolType SVar26;
  Symbol *pSVar27;
  void **head_1;
  void **head;
  pair<Kernel::TermList,_Kernel::TermList> val;
  TermStack defArgs;
  ParseResult res;
  LispListReader iaRdr;
  LispListReader pRdr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  undefined1 local_248 [16];
  anon_union_8_2_43a9448f_for_ParseResult_3 *local_238;
  anon_union_8_2_43a9448f_for_ParseResult_3 *paStack_230;
  void *local_228;
  float fStack_220;
  float fStack_21c;
  TermList local_210;
  TermStack *local_208;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  void *local_1e0;
  float fStack_1d8;
  float fStack_1d4;
  undefined1 local_1d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  LExpr *local_158;
  string *local_150;
  FixedSizeAllocator<48UL> *local_148;
  Iterator local_140;
  LExpr *local_138;
  long *local_130;
  long local_128;
  long local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_158 = body;
  bVar6 = isAlreadyKnownSymbol(this,name);
  if (bVar6) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   "Redeclaring function symbol: ",name);
    plVar17 = (long *)std::__cxx11::string::append(local_200);
    local_248._0_8_ = *plVar17;
    ppaVar20 = (anon_union_8_2_43a9448f_for_ParseResult_3 **)(plVar17 + 2);
    if ((anon_union_8_2_43a9448f_for_ParseResult_3 **)local_248._0_8_ == ppaVar20) {
      local_238 = *ppaVar20;
      paStack_230 = (anon_union_8_2_43a9448f_for_ParseResult_3 *)plVar17[3];
      local_248._0_8_ = &local_238;
    }
    else {
      local_238 = *ppaVar20;
    }
    local_248._8_8_ = plVar17[1];
    *plVar17 = (long)ppaVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_178,this->_topLevelExpr,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   in_stack_fffffffffffffda8);
    plVar17 = (long *)std::__cxx11::string::append(local_1d0);
    local_b0 = (long *)*plVar17;
    plVar21 = plVar17 + 2;
    if (local_b0 == plVar21) {
      local_a0 = *plVar21;
      uStack_98 = (undefined4)plVar17[3];
      uStack_94 = *(undefined4 *)((long)plVar17 + 0x1c);
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar21;
    }
    local_a8 = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    *puVar16 = &PTR_cry_00b69f40;
    puVar16[1] = puVar16 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar16 + 1),local_b0,local_a8 + (long)local_b0);
    *puVar16 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar16 + 5) = 0;
    puVar16[6] = puVar16 + 8;
    puVar16[7] = 0;
    *(undefined1 *)(puVar16 + 8) = 0;
    __cxa_throw(puVar16,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  local_138 = oSort;
  local_210 = parseSort(this,oSort);
  local_148 = (FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
  pDVar8 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)::Lib::FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  pDVar8->_timestamp = 1;
  pDVar8->_size = 0;
  pDVar8->_deleted = 0;
  pDVar8->_capacityIndex = 0;
  pDVar8->_capacity = 0;
  *(undefined8 *)&pDVar8->_nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&pDVar8->_entries + 4) = 0;
  *(undefined4 *)((long)&pDVar8->_afterLast + 4) = 0;
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::argSorts == '\0') {
    readDefineFun();
  }
  readDefineFun::argSorts._cursor = readDefineFun::argSorts._stack;
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::args == '\0') {
    readDefineFun();
  }
  pTVar2 = typeArgs->_cursor;
  readDefineFun::args._cursor = readDefineFun::args._stack;
  local_150 = name;
  local_208 = typeArgs;
  for (pTVar22 = typeArgs->_stack; pTVar22 != pTVar2; pTVar22 = pTVar22 + 1) {
    uVar3 = pTVar22->_content;
    if (readDefineFun::args._cursor == readDefineFun::args._end) {
      ::Lib::Stack<Kernel::TermList>::expand(&readDefineFun::args);
    }
    (readDefineFun::args._cursor)->_content = uVar3;
    readDefineFun::args._cursor = readDefineFun::args._cursor + 1;
  }
  local_140._lst = iArgs;
  if (iArgs != (LExprList *)0x0) {
    do {
      pSVar23 = this;
      local_70._M_dataplus._M_p =
           (pointer)Shell::LispListReader::readList((LispListReader *)&local_140);
      Shell::LispListReader::readAtom_abi_cxx11_((string *)local_1d0,(LispListReader *)&local_70);
      sExpr = Shell::LispListReader::readNext((LispListReader *)&local_70);
      TVar9 = parseSort(this,sExpr);
      Shell::LispListReader::acceptEOL((LispListReader *)&local_70);
      uVar7 = this->_nextVar;
      this->_nextVar = uVar7 + 1;
      this = pSVar23;
      if (readDefineFun::args._cursor == readDefineFun::args._end) {
        ::Lib::Stack<Kernel::TermList>::expand(&readDefineFun::args);
        this = pSVar23;
      }
      TVar25._content._4_4_ = 0;
      TVar25._content._0_4_ = uVar7 * 4 + 1;
      (readDefineFun::args._cursor)->_content = (uint64_t)TVar25;
      readDefineFun::args._cursor = readDefineFun::args._cursor + 1;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_1d0._0_8_,
                 (pointer)(local_1d0._0_8_ + CONCAT71(local_1d0._9_7_,local_1d0[8])));
      val.second._content = TVar9._content;
      val.first._content = TVar25._content;
      bVar6 = ::Lib::
              DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::insert(pDVar8,&local_90,val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (!bVar6) {
        puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
        std::operator+(&local_f0,"Multiple occurrence of variable ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_198._M_dataplus._M_p = (pointer)*plVar17;
        psVar18 = (size_type *)(plVar17 + 2);
        if ((size_type *)local_198._M_dataplus._M_p == psVar18) {
          local_198.field_2._M_allocated_capacity = *psVar18;
          local_198.field_2._8_8_ = plVar17[3];
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        }
        else {
          local_198.field_2._M_allocated_capacity = *psVar18;
        }
        local_198._M_string_length = plVar17[1];
        *plVar17 = (long)psVar18;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::operator+(&local_178,&local_198,local_150);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_200._0_8_ = *plVar17;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._0_8_ == paVar19) {
          local_1f0._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_1f0._8_8_ = plVar17[3];
          local_200._0_8_ = &local_1f0;
        }
        else {
          local_1f0._M_allocated_capacity = paVar19->_M_allocated_capacity;
        }
        local_200._8_8_ = plVar17[1];
        *plVar17 = (long)paVar19;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        Shell::LispParser::Expression::toString_abi_cxx11_(&local_110,this->_topLevelExpr,true);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       in_stack_fffffffffffffda8);
        plVar17 = (long *)std::__cxx11::string::append(local_248);
        local_d0 = (long *)*plVar17;
        plVar21 = plVar17 + 2;
        if (local_d0 == plVar21) {
          local_c0 = *plVar21;
          uStack_b8 = (undefined4)plVar17[3];
          uStack_b4 = *(undefined4 *)((long)plVar17 + 0x1c);
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar21;
        }
        local_c8 = plVar17[1];
        *plVar17 = (long)plVar21;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        *puVar16 = &PTR_cry_00b69f40;
        puVar16[1] = puVar16 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar16 + 1),local_d0,local_c8 + (long)local_d0);
        *puVar16 = &PTR_cry_00b6a028;
        *(undefined4 *)(puVar16 + 5) = 0;
        puVar16[6] = puVar16 + 8;
        puVar16[7] = 0;
        *(undefined1 *)(puVar16 + 8) = 0;
        __cxa_throw(puVar16,&::Lib::UserErrorException::typeinfo,
                    ::Lib::UserErrorException::~UserErrorException);
      }
      if (readDefineFun::argSorts._cursor == readDefineFun::argSorts._end) {
        ::Lib::Stack<Kernel::TermList>::expand(&readDefineFun::argSorts);
      }
      (readDefineFun::argSorts._cursor)->_content = (uint64_t)TVar9;
      readDefineFun::argSorts._cursor = readDefineFun::argSorts._cursor + 1;
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
    } while (local_140._lst != (LExprList *)0x0);
  }
  pSVar23 = this;
  if ((this->_scopes)._cursor == (this->_scopes)._end) {
    ::Lib::
    Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
    ::expand(&this->_scopes);
  }
  name_00 = local_150;
  *(this->_scopes)._cursor = pDVar8;
  pppDVar1 = &(this->_scopes)._cursor;
  *pppDVar1 = *pppDVar1 + 1;
  DVar10.first = 0;
  DVar10.second = FUNCTION;
  SVar26 = FUNCTION;
  if (recursive) {
    DVar10 = declareFunctionOrPredicate
                       (this,local_150,local_210,&readDefineFun::argSorts,
                        (uint)((ulong)((long)local_208->_cursor - (long)local_208->_stack) >> 3));
    SVar26 = DVar10.second;
  }
  parseTermOrFormula((ParseResult *)local_1d0,this,local_158,false);
  ppDVar4 = (this->_scopes)._cursor;
  (this->_scopes)._cursor = ppDVar4 + -1;
  pDVar8 = ppDVar4[-1];
  if (pDVar8 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                 *)0x0) {
    ::Lib::
    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::~DHMap(pDVar8);
    pDVar8->_timestamp = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
    pDVar8->_size = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar8;
  }
  arg2 = local_1a0;
  if ((bool)local_1d0[8] == true) {
    arg2.frm = (Formula *)Kernel::Term::createFormula(local_1a0.frm);
    local_1d0._0_8_ = Kernel::AtomicSort::boolSort();
  }
  if (local_1d0._0_8_ == local_210._content) {
    if (!recursive) {
      DVar10 = declareFunctionOrPredicate
                         (this,name_00,local_210,&readDefineFun::argSorts,
                          (uint)((ulong)((long)local_208->_cursor - (long)local_208->_stack) >> 3));
      SVar26 = DVar10.second;
    }
    uVar7 = DVar10.first;
    if (SVar26 == FUNCTION) {
      pSVar27 = (DAT_00b7e1b0->_funs)._stack[(ulong)DVar10 & 0xffffffff];
      pTVar14 = Kernel::Term::create
                          (uVar7,(uint)((ulong)((long)readDefineFun::args._cursor -
                                               (long)readDefineFun::args._stack) >> 3),
                           readDefineFun::args._stack);
      uVar7 = Kernel::Signature::getFnDef(DAT_00b7e1b0,uVar7);
      ::Lib::Stack<Kernel::TermList>::Stack((Stack<Kernel::TermList> *)local_248,local_208);
      if (local_238 == paStack_230) {
        ::Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)local_248);
      }
      local_238->frm = (Formula *)pTVar14;
      local_238 = local_238 + 1;
      if (local_238 == paStack_230) {
        ::Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)local_248);
      }
      local_238->frm = (Formula *)arg2;
      local_238 = local_238 + 1;
      pLVar11 = Kernel::Literal::create
                          (uVar7,(uint)((ulong)((long)local_238 - local_248._8_8_) >> 3),true,
                           (TermList *)local_248._8_8_);
      if ((TermList *)local_248._8_8_ != (TermList *)0x0) {
        uVar15 = local_248._0_8_ * 8 + 0xfU & 0xfffffffffffffff0;
        if (uVar15 == 0) {
          *(uint64_t *)local_248._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x11) {
          *(uint64_t *)local_248._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x19) {
          *(uint64_t *)local_248._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x21) {
          *(uint64_t *)local_248._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x31) {
          *(uint64_t *)local_248._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x41) {
          *(uint64_t *)local_248._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_248._8_8_;
        }
        else {
          operator_delete((void *)local_248._8_8_,0x10);
        }
      }
    }
    else {
      pSVar27 = (DAT_00b7e1b0->_preds)._stack[(ulong)DVar10 & 0xffffffff];
      uVar7 = Kernel::Signature::getBoolDef(DAT_00b7e1b0,uVar7);
      formula = (Formula *)::Lib::FixedSizeAllocator<48UL>::alloc(local_148);
      pLVar11 = Kernel::Literal::create
                          (uVar7,(uint)((ulong)((long)readDefineFun::args._cursor -
                                               (long)readDefineFun::args._stack) >> 3),true,
                           readDefineFun::args._stack);
      formula->_connective = LITERAL;
      (formula->_label)._M_dataplus._M_p = (pointer)&(formula->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&formula->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(formula + 1) = pLVar11;
      TVar9._content = (uint64_t)Kernel::Term::createFormula(formula);
      pLVar11 = Kernel::Literal::createEquality(true,TVar9,arg2.trm,local_210);
    }
    puVar12 = (undefined4 *)::Lib::FixedSizeAllocator<48UL>::alloc(local_148);
    *puVar12 = 0;
    *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(puVar12 + 10) = pLVar11;
    pSVar27->field_0x40 = pSVar27->field_0x40 | 8;
    this_00 = (Unit *)::operator_new(0x48,8);
    local_178._M_dataplus._M_p._0_1_ = 1;
    Kernel::Inference::Inference((Inference *)local_200,(FromInput *)&local_178);
    local_228 = local_1e0;
    fStack_220 = fStack_1d8;
    fStack_21c = fStack_1d4;
    local_238 = (anon_union_8_2_43a9448f_for_ParseResult_3 *)local_1f0._M_allocated_capacity;
    paStack_230 = (anon_union_8_2_43a9448f_for_ParseResult_3 *)local_1f0._8_8_;
    local_248._0_8_ = local_200._0_8_;
    local_248._8_8_ = local_200._8_8_;
    Kernel::Unit::Unit(this_00,FORMULA,(Inference *)local_248);
    *(undefined4 **)(this_00 + 1) = puVar12;
    *(undefined8 *)&this_00[1]._inference = 3;
    Kernel::Unit::doUnitTracing(this_00);
    pLVar13 = (List<Kernel::Unit_*> *)
              ::Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pLVar13->_head = this_00;
    pLVar13->_tail = (List<Kernel::Unit_*> *)0x0;
    pLVar5 = (pSVar23->_formulas)._last;
    pFVar24 = (FIFO *)&pLVar5->_tail;
    if (pLVar5 == (List<Kernel::Unit_*> *)0x0) {
      pFVar24 = &pSVar23->_formulas;
    }
    pFVar24->_first = pLVar13;
    (pSVar23->_formulas)._last = pLVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,local_1b0._M_allocated_capacity + 1);
    }
    return;
  }
  puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_110,local_158,true);
  std::operator+(&local_f0,"Defined function body ",&local_110);
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_198._M_dataplus._M_p = (pointer)*plVar17;
  psVar18 = (size_type *)(plVar17 + 2);
  if ((size_type *)local_198._M_dataplus._M_p == psVar18) {
    local_198.field_2._M_allocated_capacity = *psVar18;
    local_198.field_2._8_8_ = plVar17[3];
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar18;
  }
  local_198._M_string_length = plVar17[1];
  *plVar17 = (long)psVar18;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_70,local_138,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar23,
                 in_stack_fffffffffffffda8);
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_200._0_8_ = *plVar17;
  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._0_8_ == paVar19) {
    local_1f0._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_1f0._8_8_ = plVar17[3];
    local_200._0_8_ = &local_1f0;
  }
  else {
    local_1f0._M_allocated_capacity = paVar19->_M_allocated_capacity;
  }
  local_200._8_8_ = plVar17[1];
  *plVar17 = (long)paVar19;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_50,pSVar23->_topLevelExpr,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar23,
                 in_stack_fffffffffffffda8);
  plVar17 = (long *)std::__cxx11::string::append(local_248);
  local_130 = (long *)*plVar17;
  plVar21 = plVar17 + 2;
  if (local_130 == plVar21) {
    local_120 = *plVar21;
    uStack_118 = (undefined4)plVar17[3];
    uStack_114 = *(undefined4 *)((long)plVar17 + 0x1c);
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar21;
  }
  local_128 = plVar17[1];
  *plVar17 = (long)plVar21;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  *puVar16 = &PTR_cry_00b69f40;
  puVar16[1] = puVar16 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar16 + 1),local_130,local_128 + (long)local_130);
  *puVar16 = &PTR_cry_00b6a028;
  *(undefined4 *)(puVar16 + 5) = 0;
  puVar16[6] = puVar16 + 8;
  puVar16[7] = 0;
  *(undefined1 *)(puVar16 + 8) = 0;
  __cxa_throw(puVar16,&::Lib::UserErrorException::typeinfo,
              ::Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::readDefineFun(const std::string& name, LExprList* iArgs, LExpr* oSort, LExpr* body, const TermStack& typeArgs, bool recursive)
{
  if (isAlreadyKnownSymbol(name)) {
    USER_ERROR_EXPR("Redeclaring function symbol: "+name);
  }

  TermList rangeSort = parseSort(oSort);

  TermLookup* lookup = new TermLookup();

  static TermStack argSorts;
  argSorts.reset();

  static TermStack args;
  args.reset();
  for (const auto& ta : typeArgs) {
    args.push(ta);
  }

  LispListReader iaRdr(iArgs);
  while (iaRdr.hasNext()) {
    LExprList* pair = iaRdr.readList();
    LispListReader pRdr(pair);

    std::string vName = pRdr.readAtom();
    TermList vSort = parseSort(pRdr.readNext());

    pRdr.acceptEOL();

    TermList arg = TermList::var(_nextVar++);
    args.push(arg);

    if (!lookup->insert(vName,make_pair(arg,vSort))) {
      USER_ERROR_EXPR("Multiple occurrence of variable "+vName+" in the definition of function "+name);
    }

    argSorts.push(vSort);
  }

  _scopes.push(lookup);

  DeclaredSymbol fun;
  if (recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  delete _scopes.pop();

  TermList rhs;
  if (res.asTerm(rhs) != rangeSort) {
    USER_ERROR_EXPR("Defined function body "+body->toString()+" has different sort than declared "+oSort->toString());
  }

  if (!recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  unsigned symbIdx = fun.first;
  ASS(fun.second != SymbolType::TYPECON);
  bool isTrueFun = fun.second==SymbolType::FUNCTION;

  Literal* lit;
  Signature::Symbol* sym;
  if (isTrueFun) {
    sym = env.signature->getFunction(symbIdx);

    TermList lhs(Term::create(symbIdx,args.size(),args.begin()));
    auto p = env.signature->getFnDef(symbIdx);
    auto defArgs = typeArgs;
    defArgs.push(lhs);
    defArgs.push(rhs);
    lit = Literal::create(p,defArgs.size(),true,defArgs.begin());
  } else {
    sym = env.signature->getPredicate(symbIdx);

    auto p = env.signature->getBoolDef(symbIdx);
    TermList lhs(Term::createFormula(new AtomicFormula(Literal::create(p,args.size(),true,args.begin()))));
    lit = Literal::createEquality(true, lhs, rhs, rangeSort);
  }
  Formula* fla = new AtomicFormula(lit);

  // Mark original symbol protected to avoid
  // erroneous unused symbol elimination later.
  // TODO find a better way to do this
  sym->markProtected();

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));

  _formulas.pushBack(fu);
}